

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

void __thiscall
vmips::Ternary::replace
          (Ternary *this,shared_ptr<vmips::VirtReg> *reg,shared_ptr<vmips::VirtReg> *target)

{
  bool bVar1;
  
  bVar1 = VirtReg::operator==((this->lhs).
                              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (reg->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  if (bVar1) {
    (this->lhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->lhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              );
  }
  bVar1 = VirtReg::operator==((this->op0).
                              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (reg->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  if (bVar1) {
    (this->op0).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->op0).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              );
  }
  bVar1 = VirtReg::operator==((this->op1).
                              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (reg->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  if (bVar1) {
    (this->op1).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->op1).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              );
    return;
  }
  return;
}

Assistant:

void Ternary::replace(const std::shared_ptr<VirtReg> &reg, const std::shared_ptr<VirtReg> &target) {
    if (*lhs == *reg) lhs = target;
    if (*op0 == *reg) op0 = target;
    if (*op1 == *reg) op1 = target;
}